

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O1

StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
google::protobuf::json_internal::Proto3Type::EnumNameByNumber_abi_cxx11_
          (StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Proto3Type *this,Field f,int32_t number)

{
  long lVar1;
  Rep *pRVar2;
  long *plVar3;
  RepeatedPtrFieldBase *pRVar4;
  RepeatedPtrFieldBase *this_00;
  Status _status;
  StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*> e;
  Status local_70;
  Status local_68;
  undefined8 local_60;
  long local_58 [2];
  HeapOrSoo local_48;
  Message *local_38;
  code *local_30;
  
  ResolverPool::Field::EnumType((Field *)&local_48.heap);
  local_68.rep_ = (uintptr_t)local_48.heap.control;
  if (((ulong)local_48.heap.control & 1) == 0) {
    LOCK();
    *(undefined4 *)local_48.heap.control = *(undefined4 *)local_48.heap.control + ~kDeleted;
    UNLOCK();
  }
  if (local_48.heap.control == (ctrl_t *)0x1) {
    this_00 = (RepeatedPtrFieldBase *)((long)local_48.heap.slot_array + 0x20);
    pRVar4 = this_00;
    if ((*(byte *)((long)local_48.heap.slot_array + 0x20) & 1) != 0) {
      pRVar2 = internal::RepeatedPtrFieldBase::rep(this_00);
      pRVar4 = (RepeatedPtrFieldBase *)pRVar2->elements;
    }
    if (((ulong)this_00->tagged_rep_or_elem_ & 1) != 0) {
      pRVar2 = internal::RepeatedPtrFieldBase::rep(this_00);
      this_00 = (RepeatedPtrFieldBase *)pRVar2->elements;
    }
    for (; pRVar4 != (RepeatedPtrFieldBase *)
                     (&this_00->tagged_rep_or_elem_ +
                     *(int *)((long)local_48.heap.slot_array + 0x28));
        pRVar4 = (RepeatedPtrFieldBase *)&pRVar4->current_size_) {
      if (*(int *)((long)pRVar4->tagged_rep_or_elem_ + 0x30) == (int)f) {
        plVar3 = (long *)(*(ulong *)((long)pRVar4->tagged_rep_or_elem_ + 0x28) & 0xfffffffffffffffc)
        ;
        (__return_storage_ptr__->
        super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).field_1.data_._M_dataplus._M_p =
             (pointer)((long)&(__return_storage_ptr__->
                              super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).field_1 + 0x10);
        lVar1 = *plVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   &(__return_storage_ptr__->
                    super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).field_1,lVar1,plVar3[1] + lVar1);
        (__return_storage_ptr__->
        super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).field_0 = (anon_union_8_1_1246618d_for_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_1
                     )0x1;
        goto LAB_002dc66d;
      }
    }
    local_30 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
    local_38 = (Message *)((ulong)f & 0xffffffff);
    absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
              (&local_68,"unknown enum number: \'%d\'",0x19,&local_38,1);
    absl::lts_20240722::InvalidArgumentError(&local_70,local_60,local_68.rep_);
    absl::lts_20240722::internal_statusor::
    StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    StatusOrData<absl::lts_20240722::Status,_0>
              (&__return_storage_ptr__->
                super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ,&local_70);
    if ((local_70.rep_ & 1) == 0) {
      absl::lts_20240722::status_internal::StatusRep::Unref();
    }
    if ((long *)local_68.rep_ != local_58) {
      operator_delete((void *)local_68.rep_,local_58[0] + 1);
    }
  }
  else {
    absl::lts_20240722::internal_statusor::
    StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    StatusOrData<const_absl::lts_20240722::Status,_0>
              (&__return_storage_ptr__->
                super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ,&local_68);
    absl::lts_20240722::Status::~Status(&local_68);
  }
LAB_002dc66d:
  absl::lts_20240722::internal_statusor::
  StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*>::~StatusOrData
            ((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*> *)
             &local_48.heap);
  return __return_storage_ptr__;
}

Assistant:

static absl::StatusOr<std::string> EnumNameByNumber(Field f, int32_t number) {
    auto e = f->EnumType();
    RETURN_IF_ERROR(e.status());

    for (const auto& ev : (**e).proto().enumvalue()) {
      if (ev.number() == number) {
        return ev.name();
      }
    }
    return absl::InvalidArgumentError(
        absl::StrFormat("unknown enum number: '%d'", number));
  }